

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seg_helper.c
# Opt level: O1

void switch_tss_ra(CPUX86State *env,int tss_selector,uint32_t e1,uint32_t e2,int source,
                  uint32_t next_eip,uintptr_t retaddr)

{
  byte *pbVar1;
  target_ulong tVar2;
  int iVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ulong addr;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  uint uVar15;
  abi_ptr aVar16;
  SegmentCache *pSVar17;
  target_ulong *ptVar18;
  uint32_t *puVar19;
  uint32_t new_segs [6];
  uint32_t new_regs [8];
  uint local_ac;
  uint local_a0;
  uint local_9c;
  target_ulong local_88;
  uint32_t local_78;
  uint local_74;
  int local_70;
  int local_6c;
  undefined8 local_68;
  long local_60;
  uint local_58 [10];
  
  uVar11 = e2 >> 8 & 0xf;
  if (uVar11 == 5) {
    if ((short)e2 < 0) {
      tss_selector = e1 >> 0x10;
      if ((e1 >> 0x12 & 1) == 0) {
        uVar11 = (env->gdt).limit;
        if ((tss_selector | 7U) <= uVar11) {
          uVar6 = 2;
          aVar16 = (ulong)(tss_selector & 0xfffffff8) + (env->gdt).base;
          if (((env->hflags >> 0x17 & 1) != 0) && (uVar6 = 0, (~env->hflags & 3) != 0)) {
            uVar6 = (uint)env->eflags >> 0x11 & 2;
          }
          e1 = cpu_ldl_mmuidx_ra_x86_64(env,aVar16,uVar6,retaddr);
          uVar6 = 2;
          if (((env->hflags >> 0x17 & 1) != 0) && (uVar6 = 0, (~env->hflags & 3) != 0)) {
            uVar6 = (uint)env->eflags >> 0x11 & 2;
          }
          e2 = cpu_ldl_mmuidx_ra_x86_64(env,aVar16 + 4,uVar6,retaddr);
        }
        if (uVar11 < (tss_selector | 7U)) {
          uVar11 = tss_selector & 0xfffffff8;
          iVar3 = 0xd;
          goto LAB_00520996;
        }
        if (((e2 >> 0xc & 1) != 0) || ((e2 & 0x700) != 0x100)) {
          uVar11 = tss_selector & 0xfffffff8;
          iVar3 = 0xd;
          goto LAB_00520996;
        }
        uVar11 = e2 >> 8 & 0xf;
        goto LAB_0051f7cf;
      }
      uVar11 = tss_selector & 0xfffffffc;
      goto LAB_0052098e;
    }
  }
  else {
LAB_0051f7cf:
    if ((short)e2 < 0) {
      iVar3 = 0x67;
      if (uVar11 < 8) {
        iVar3 = 0x2b;
      }
      uVar7 = e2 & 0xf0000 | e1 & 0xffff;
      uVar6 = uVar7 << 0xc | 0xfff;
      if ((e2 >> 0x17 & 1) == 0) {
        uVar6 = uVar7;
      }
      local_9c = tss_selector;
      if (((tss_selector & 4U) == 0) && (iVar3 <= (int)uVar6)) {
        uVar7 = e1 >> 0x10;
        uVar13 = (e2 & 0xff) * 0x10000;
        uVar15 = e2 & 0xff000000;
        addr = (ulong)(uVar15 + uVar7 | uVar13);
        local_60 = 0x67;
        if (((env->tr).flags & 0x800) == 0) {
          local_60 = 0x2b;
        }
        uVar10 = env->hflags;
        if (uVar11 < 8) {
          uVar9 = 2;
          uVar8 = 2;
          if (((uVar10 >> 0x17 & 1) != 0) && (uVar8 = 0, (~uVar10 & 3) != 0)) {
            uVar8 = (uint)env->eflags >> 0x11 & 2;
          }
          local_a0 = cpu_lduw_mmuidx_ra_x86_64(env,addr + 0xe,uVar8,retaddr);
          if (((env->hflags >> 0x17 & 1) != 0) && (uVar9 = 0, (~env->hflags & 3) != 0)) {
            uVar9 = (uint)env->eflags >> 0x11 & 2;
          }
          local_ac = cpu_lduw_mmuidx_ra_x86_64(env,addr + 0x10,uVar9,retaddr);
          uVar12 = (ulong)(uVar7 + uVar15 + uVar13);
          lVar14 = 0;
          do {
            uVar7 = 2;
            if (((env->hflags >> 0x17 & 1) != 0) && (uVar7 = 0, (~env->hflags & 3) != 0)) {
              uVar7 = (uint)env->eflags >> 0x11 & 2;
            }
            uVar4 = cpu_lduw_mmuidx_ra_x86_64(env,uVar12 + 0x12 + lVar14,uVar7,retaddr);
            *(uint32_t *)((long)local_58 + lVar14 * 2) = uVar4 | 0xffff0000;
            lVar14 = lVar14 + 2;
          } while (lVar14 != 0x10);
          lVar14 = 0;
          do {
            uVar7 = 2;
            if (((env->hflags >> 0x17 & 1) != 0) && (uVar7 = 0, (~env->hflags & 3) != 0)) {
              uVar7 = (uint)env->eflags >> 0x11 & 2;
            }
            uVar4 = cpu_lduw_mmuidx_ra_x86_64(env,uVar12 + 0x22 + lVar14,uVar7,retaddr);
            *(uint32_t *)((long)&local_78 + lVar14) = uVar4;
            lVar14 = lVar14 + 4;
          } while (lVar14 != 0x10);
          uVar7 = 2;
          if (((env->hflags >> 0x17 & 1) != 0) && (uVar7 = 0, (~env->hflags & 3) != 0)) {
            uVar7 = (uint)env->eflags >> 0x11 & 2;
          }
          local_9c = cpu_lduw_mmuidx_ra_x86_64(env,addr + 0x2a,uVar7,retaddr);
          local_68 = 0;
          local_88 = 0;
          lVar14 = local_60;
        }
        else {
          uVar9 = 2;
          uVar8 = 2;
          if (((uVar10 >> 0x17 & 1) != 0) && (uVar8 = 0, (~uVar10 & 3) != 0)) {
            uVar8 = (uint)env->eflags >> 0x11 & 2;
          }
          uVar4 = cpu_ldl_mmuidx_ra_x86_64(env,addr + 0x1c,uVar8,retaddr);
          if (((env->hflags >> 0x17 & 1) != 0) && (uVar9 = 0, (~env->hflags & 3) != 0)) {
            uVar9 = (uint)env->eflags >> 0x11 & 2;
          }
          local_a0 = cpu_ldl_mmuidx_ra_x86_64(env,addr + 0x20,uVar9,retaddr);
          uVar10 = 2;
          if (((env->hflags >> 0x17 & 1) != 0) && (uVar10 = 0, (~env->hflags & 3) != 0)) {
            uVar10 = (uint)env->eflags >> 0x11 & 2;
          }
          local_ac = cpu_ldl_mmuidx_ra_x86_64(env,addr + 0x24,uVar10,retaddr);
          uVar12 = (ulong)(uVar7 + uVar15 + uVar13);
          lVar14 = 0;
          do {
            uVar7 = 2;
            if (((env->hflags >> 0x17 & 1) != 0) && (uVar7 = 0, (~env->hflags & 3) != 0)) {
              uVar7 = (uint)env->eflags >> 0x11 & 2;
            }
            uVar5 = cpu_ldl_mmuidx_ra_x86_64(env,uVar12 + 0x28 + lVar14,uVar7,retaddr);
            *(uint32_t *)((long)local_58 + lVar14) = uVar5;
            lVar14 = lVar14 + 4;
          } while (lVar14 != 0x20);
          lVar14 = 0;
          do {
            uVar7 = 2;
            if (((env->hflags >> 0x17 & 1) != 0) && (uVar7 = 0, (~env->hflags & 3) != 0)) {
              uVar7 = (uint)env->eflags >> 0x11 & 2;
            }
            uVar5 = cpu_lduw_mmuidx_ra_x86_64(env,uVar12 + 0x48 + lVar14,uVar7,retaddr);
            *(uint32_t *)((long)&local_78 + lVar14) = uVar5;
            lVar14 = lVar14 + 4;
          } while (lVar14 != 0x18);
          uVar13 = 2;
          uVar7 = 2;
          if (((env->hflags >> 0x17 & 1) != 0) && (uVar7 = 0, (~env->hflags & 3) != 0)) {
            uVar7 = (uint)env->eflags >> 0x11 & 2;
          }
          local_9c = cpu_lduw_mmuidx_ra_x86_64(env,addr + 0x60,uVar7,retaddr);
          lVar14 = local_60;
          if (((env->hflags >> 0x17 & 1) != 0) && (uVar13 = 0, (~env->hflags & 3) != 0)) {
            uVar13 = (uint)env->eflags >> 0x11 & 2;
          }
          cpu_ldl_mmuidx_ra_x86_64(env,addr + 100,uVar13,retaddr);
          local_88 = (target_ulong)uVar4;
        }
        uVar13 = 2;
        uVar7 = 2;
        if (((env->hflags >> 0x17 & 1) != 0) && (uVar7 = 0, (~env->hflags & 3) != 0)) {
          uVar7 = (uint)env->eflags >> 0x11 & 2;
        }
        uVar4 = cpu_ldub_mmuidx_ra_x86_64(env,(env->tr).base,uVar7,retaddr);
        if (((env->hflags >> 0x17 & 1) != 0) && (uVar13 = 0, (~env->hflags & 3) != 0)) {
          uVar13 = (uint)env->eflags >> 0x11 & 2;
        }
        uVar5 = cpu_ldub_mmuidx_ra_x86_64(env,(env->tr).base + lVar14,uVar13,retaddr);
        uVar13 = 2;
        uVar7 = 2;
        if (((env->hflags >> 0x17 & 1) != 0) && (uVar7 = 0, (~env->hflags & 3) != 0)) {
          uVar7 = (uint)env->eflags >> 0x11 & 2;
        }
        cpu_stb_mmuidx_ra_x86_64(env,(env->tr).base,uVar4,uVar7,retaddr);
        if (((env->hflags >> 0x17 & 1) != 0) && (uVar13 = 0, (~env->hflags & 3) != 0)) {
          uVar13 = (uint)env->eflags >> 0x11 & 2;
        }
        cpu_stb_mmuidx_ra_x86_64(env,lVar14 + (env->tr).base,uVar5,uVar13,retaddr);
        if ((uint)source < 2) {
          aVar16 = (env->gdt).base + (ulong)((env->tr).selector & 0xfffffff8) + 4;
          uVar13 = 2;
          uVar7 = 2;
          if (((env->hflags >> 0x17 & 1) != 0) && (uVar7 = 0, (~env->hflags & 3) != 0)) {
            uVar7 = (uint)env->eflags >> 0x11 & 2;
          }
          uVar4 = cpu_ldl_mmuidx_ra_x86_64(env,aVar16,uVar7,retaddr);
          if (((env->hflags >> 0x17 & 1) != 0) && (uVar13 = 0, (~env->hflags & 3) != 0)) {
            uVar13 = (uint)env->eflags >> 0x11 & 2;
          }
          cpu_stl_mmuidx_ra_x86_64(env,aVar16,uVar4 & 0xfffffdff,uVar13,retaddr);
        }
        tVar2 = env->eflags;
        uVar4 = cpu_cc_compute_all_x86_64(env,env->cc_op);
        uVar13 = uVar4 | (uint)tVar2 & 0xfffff32a;
        uVar7 = uVar13 & 0xffffbfff;
        if (source != 1) {
          uVar7 = uVar13;
        }
        uVar7 = uVar7 | env->df & 0x400U;
        tVar2 = (env->tr).base;
        uVar13 = env->hflags;
        if (uVar11 < 8) {
          uVar10 = 2;
          uVar15 = 2;
          if (((uVar13 >> 0x17 & 1) != 0) && (uVar15 = 0, (~uVar13 & 3) != 0)) {
            uVar15 = (uint)env->eflags >> 0x11 & 2;
          }
          cpu_stw_mmuidx_ra_x86_64(env,tVar2 + 0xe,next_eip,uVar15,retaddr);
          if (((env->hflags >> 0x17 & 1) != 0) && (uVar10 = 0, (~env->hflags & 3) != 0)) {
            uVar10 = (uint)env->eflags >> 0x11 & 2;
          }
          cpu_stw_mmuidx_ra_x86_64(env,(env->tr).base + 0x10,uVar7,uVar10,retaddr);
          uVar13 = 2;
          uVar7 = 2;
          if (((env->hflags >> 0x17 & 1) != 0) && (uVar7 = 0, (~env->hflags & 3) != 0)) {
            uVar7 = (uint)env->eflags >> 0x11 & 2;
          }
          cpu_stw_mmuidx_ra_x86_64(env,(env->tr).base + 0x12,(uint32_t)env->regs[0],uVar7,retaddr);
          if (((env->hflags >> 0x17 & 1) != 0) && (uVar13 = 0, (~env->hflags & 3) != 0)) {
            uVar13 = (uint)env->eflags >> 0x11 & 2;
          }
          cpu_stw_mmuidx_ra_x86_64(env,(env->tr).base + 0x14,(uint32_t)env->regs[1],uVar13,retaddr);
          uVar13 = 2;
          uVar7 = 2;
          if (((env->hflags >> 0x17 & 1) != 0) && (uVar7 = 0, (~env->hflags & 3) != 0)) {
            uVar7 = (uint)env->eflags >> 0x11 & 2;
          }
          cpu_stw_mmuidx_ra_x86_64(env,(env->tr).base + 0x16,(uint32_t)env->regs[2],uVar7,retaddr);
          if (((env->hflags >> 0x17 & 1) != 0) && (uVar13 = 0, (~env->hflags & 3) != 0)) {
            uVar13 = (uint)env->eflags >> 0x11 & 2;
          }
          cpu_stw_mmuidx_ra_x86_64(env,(env->tr).base + 0x18,(uint32_t)env->regs[3],uVar13,retaddr);
          uVar13 = 2;
          uVar7 = 2;
          if (((env->hflags >> 0x17 & 1) != 0) && (uVar7 = 0, (~env->hflags & 3) != 0)) {
            uVar7 = (uint)env->eflags >> 0x11 & 2;
          }
          cpu_stw_mmuidx_ra_x86_64(env,(env->tr).base + 0x1a,(uint32_t)env->regs[4],uVar7,retaddr);
          if (((env->hflags >> 0x17 & 1) != 0) && (uVar13 = 0, (~env->hflags & 3) != 0)) {
            uVar13 = (uint)env->eflags >> 0x11 & 2;
          }
          cpu_stw_mmuidx_ra_x86_64(env,(env->tr).base + 0x1c,(uint32_t)env->regs[5],uVar13,retaddr);
          uVar13 = 2;
          uVar7 = 2;
          if (((env->hflags >> 0x17 & 1) != 0) && (uVar7 = 0, (~env->hflags & 3) != 0)) {
            uVar7 = (uint)env->eflags >> 0x11 & 2;
          }
          cpu_stw_mmuidx_ra_x86_64(env,(env->tr).base + 0x1e,(uint32_t)env->regs[6],uVar7,retaddr);
          if (((env->hflags >> 0x17 & 1) != 0) && (uVar13 = 0, (~env->hflags & 3) != 0)) {
            uVar13 = (uint)env->eflags >> 0x11 & 2;
          }
          cpu_stw_mmuidx_ra_x86_64(env,(env->tr).base + 0x20,(uint32_t)env->regs[7],uVar13,retaddr);
          pSVar17 = env->segs;
          lVar14 = 0x22;
          do {
            uVar7 = 2;
            if (((env->hflags >> 0x17 & 1) != 0) && (uVar7 = 0, (~env->hflags & 3) != 0)) {
              uVar7 = (uint)env->eflags >> 0x11 & 2;
            }
            cpu_stw_mmuidx_ra_x86_64(env,(env->tr).base + lVar14,pSVar17->selector,uVar7,retaddr);
            lVar14 = lVar14 + 4;
            pSVar17 = pSVar17 + 1;
          } while (lVar14 != 0x32);
        }
        else {
          uVar10 = 2;
          uVar15 = 2;
          if (((uVar13 >> 0x17 & 1) != 0) && (uVar15 = 0, (~uVar13 & 3) != 0)) {
            uVar15 = (uint)env->eflags >> 0x11 & 2;
          }
          cpu_stl_mmuidx_ra_x86_64(env,tVar2 + 0x20,next_eip,uVar15,retaddr);
          if (((env->hflags >> 0x17 & 1) != 0) && (uVar10 = 0, (~env->hflags & 3) != 0)) {
            uVar10 = (uint)env->eflags >> 0x11 & 2;
          }
          cpu_stl_mmuidx_ra_x86_64(env,(env->tr).base + 0x24,uVar7,uVar10,retaddr);
          uVar13 = 2;
          uVar7 = 2;
          if (((env->hflags >> 0x17 & 1) != 0) && (uVar7 = 0, (~env->hflags & 3) != 0)) {
            uVar7 = (uint)env->eflags >> 0x11 & 2;
          }
          cpu_stl_mmuidx_ra_x86_64(env,(env->tr).base + 0x28,(uint32_t)env->regs[0],uVar7,retaddr);
          if (((env->hflags >> 0x17 & 1) != 0) && (uVar13 = 0, (~env->hflags & 3) != 0)) {
            uVar13 = (uint)env->eflags >> 0x11 & 2;
          }
          cpu_stl_mmuidx_ra_x86_64(env,(env->tr).base + 0x2c,(uint32_t)env->regs[1],uVar13,retaddr);
          uVar13 = 2;
          uVar7 = 2;
          if (((env->hflags >> 0x17 & 1) != 0) && (uVar7 = 0, (~env->hflags & 3) != 0)) {
            uVar7 = (uint)env->eflags >> 0x11 & 2;
          }
          cpu_stl_mmuidx_ra_x86_64(env,(env->tr).base + 0x30,(uint32_t)env->regs[2],uVar7,retaddr);
          if (((env->hflags >> 0x17 & 1) != 0) && (uVar13 = 0, (~env->hflags & 3) != 0)) {
            uVar13 = (uint)env->eflags >> 0x11 & 2;
          }
          cpu_stl_mmuidx_ra_x86_64(env,(env->tr).base + 0x34,(uint32_t)env->regs[3],uVar13,retaddr);
          uVar13 = 2;
          uVar7 = 2;
          if (((env->hflags >> 0x17 & 1) != 0) && (uVar7 = 0, (~env->hflags & 3) != 0)) {
            uVar7 = (uint)env->eflags >> 0x11 & 2;
          }
          cpu_stl_mmuidx_ra_x86_64(env,(env->tr).base + 0x38,(uint32_t)env->regs[4],uVar7,retaddr);
          if (((env->hflags >> 0x17 & 1) != 0) && (uVar13 = 0, (~env->hflags & 3) != 0)) {
            uVar13 = (uint)env->eflags >> 0x11 & 2;
          }
          cpu_stl_mmuidx_ra_x86_64(env,(env->tr).base + 0x3c,(uint32_t)env->regs[5],uVar13,retaddr);
          uVar13 = 2;
          uVar7 = 2;
          if (((env->hflags >> 0x17 & 1) != 0) && (uVar7 = 0, (~env->hflags & 3) != 0)) {
            uVar7 = (uint)env->eflags >> 0x11 & 2;
          }
          cpu_stl_mmuidx_ra_x86_64(env,(env->tr).base + 0x40,(uint32_t)env->regs[6],uVar7,retaddr);
          if (((env->hflags >> 0x17 & 1) != 0) && (uVar13 = 0, (~env->hflags & 3) != 0)) {
            uVar13 = (uint)env->eflags >> 0x11 & 2;
          }
          cpu_stl_mmuidx_ra_x86_64(env,(env->tr).base + 0x44,(uint32_t)env->regs[7],uVar13,retaddr);
          pSVar17 = env->segs;
          lVar14 = 0x48;
          do {
            uVar7 = 2;
            if (((env->hflags >> 0x17 & 1) != 0) && (uVar7 = 0, (~env->hflags & 3) != 0)) {
              uVar7 = (uint)env->eflags >> 0x11 & 2;
            }
            cpu_stw_mmuidx_ra_x86_64(env,(env->tr).base + lVar14,pSVar17->selector,uVar7,retaddr);
            lVar14 = lVar14 + 4;
            pSVar17 = pSVar17 + 1;
          } while (lVar14 != 0x60);
        }
        if (source == 2) {
          uVar7 = 2;
          if (((env->hflags >> 0x17 & 1) != 0) && (uVar7 = 0, (~env->hflags & 3) != 0)) {
            uVar7 = (uint)env->eflags >> 0x11 & 2;
          }
          cpu_stw_mmuidx_ra_x86_64(env,addr,(env->tr).selector,uVar7,retaddr);
          local_ac = local_ac | 0x4000;
        }
        if ((source & 0xfffffffdU) == 0) {
          uVar13 = 2;
          uVar7 = 2;
          aVar16 = (long)(int)(tss_selector & 0xfffffff8U | 4) + (env->gdt).base;
          if (((env->hflags >> 0x17 & 1) != 0) && (uVar7 = 0, (~env->hflags & 3) != 0)) {
            uVar7 = (uint)env->eflags >> 0x11 & 2;
          }
          uVar4 = cpu_ldl_mmuidx_ra_x86_64(env,aVar16,uVar7,retaddr);
          if (((env->hflags >> 0x17 & 1) != 0) && (uVar13 = 0, (~env->hflags & 3) != 0)) {
            uVar13 = (uint)env->eflags >> 0x11 & 2;
          }
          cpu_stl_mmuidx_ra_x86_64(env,aVar16,uVar4 | 0x200,uVar13,retaddr);
        }
        uVar12 = env->cr[0];
        env->cr[0] = uVar12 | 8;
        pbVar1 = (byte *)((long)&env->hflags + 1);
        *pbVar1 = *pbVar1 | 8;
        (env->tr).selector = tss_selector;
        (env->tr).base = addr;
        (env->tr).limit = uVar6;
        (env->tr).flags = e2 & 0xfffffdff;
        if ((int)uVar12 < 0 && 7 < uVar11) {
          cpu_x86_update_cr3_x86_64(env,local_88);
        }
        env->eip = (ulong)local_a0;
        uVar6 = 0x277300;
        if (uVar11 < 8) {
          uVar6 = 0x7300;
        }
        env->cc_src = (ulong)(local_ac & 0x8d5);
        env->cc_op = 1;
        env->df = 1 - (local_ac >> 9 & 2);
        env->eflags = (ulong)(local_ac & uVar6 | 2) | (long)(int)~uVar6 & env->eflags;
        env->regs[0] = (ulong)local_58[0];
        env->regs[1] = (ulong)local_58[1];
        env->regs[2] = (ulong)local_58[2];
        env->regs[3] = (ulong)local_58[3];
        env->regs[4] = (ulong)local_58[4];
        env->regs[5] = (ulong)local_58[5];
        env->regs[6] = (ulong)local_58[6];
        env->regs[7] = (ulong)local_58[7];
        if ((local_ac >> 0x11 & 1) == 0) {
          ptVar18 = &env->segs[0].base;
          lVar14 = 0;
          do {
            ((SegmentCache *)(ptVar18 + -1))->selector = (&local_78)[lVar14];
            *ptVar18 = 0;
            ptVar18[1] = 0;
            if ((int)lVar14 == 2) {
              *(byte *)&env->hflags = (byte)env->hflags & 0xfc;
              cpu_sync_bndcs_hflags_x86_64(env);
            }
            else if ((int)lVar14 == 1) {
              env->hflags = env->hflags & 0xffff7fef | env->segs[1].flags >> 0x12 & 0x10;
            }
            uVar11 = env->hflags;
            uVar6 = env->segs[2].flags >> 0x11 & 0x20;
            if (-1 < (short)uVar11) {
              if ((((env->cr[0] & 1) == 0) || ((uVar11 & 0x10) == 0)) ||
                 ((env->eflags & 0x20000) != 0)) {
                uVar6 = uVar6 | 0x40;
              }
              else {
                uVar6 = uVar6 | (uint)((env->segs[0].base != 0 || env->segs[3].base != 0) ||
                                      env->segs[2].base != 0) << 6;
              }
            }
            env->hflags = uVar11 & 0xffffff9f | uVar6;
            lVar14 = lVar14 + 1;
            ptVar18 = ptVar18 + 3;
          } while (lVar14 != 6);
        }
        else {
          puVar19 = &env->segs[0].flags;
          lVar14 = 0;
          do {
            uVar4 = (&local_78)[lVar14];
            ((SegmentCache *)(puVar19 + -5))->selector = (uint)(ushort)uVar4;
            *(ulong *)(puVar19 + -3) = (ulong)(ushort)uVar4 << 4;
            *(undefined8 *)(puVar19 + -1) = 0xf3000000ffff;
            if ((int)lVar14 == 2) {
              *(byte *)&env->hflags = (byte)env->hflags | 3;
              cpu_sync_bndcs_hflags_x86_64(env);
            }
            else if ((int)lVar14 == 1) {
              env->hflags = env->hflags & 0xffff7fef | env->segs[1].flags >> 0x12 & 0x10;
            }
            uVar11 = env->hflags;
            uVar6 = env->segs[2].flags >> 0x11 & 0x20;
            if (-1 < (short)uVar11) {
              if ((((env->cr[0] & 1) == 0) || ((uVar11 & 0x10) == 0)) ||
                 ((env->eflags & 0x20000) != 0)) {
                uVar6 = uVar6 | 0x40;
              }
              else {
                uVar6 = uVar6 | (uint)((env->segs[0].base != 0 || env->segs[3].base != 0) ||
                                      env->segs[2].base != 0) << 6;
              }
            }
            env->hflags = uVar11 & 0xffffff9f | uVar6;
            lVar14 = lVar14 + 1;
            puVar19 = puVar19 + 6;
          } while (lVar14 != 6);
        }
        (env->ldt).selector = local_9c & 0xfffffffb;
        (env->ldt).base = 0;
        (env->ldt).limit = 0;
        (env->ldt).flags = 0;
        if ((local_9c & 4) == 0) {
          uVar11 = local_9c & 0xfff8;
          if (uVar11 == 0) {
LAB_0052086b:
            if ((local_ac >> 0x11 & 1) == 0) {
              uVar11 = local_74 & 3;
              tss_load_seg(env,1,local_74,uVar11,retaddr);
              tss_load_seg(env,2,local_70,uVar11,retaddr);
              tss_load_seg(env,0,local_78,uVar11,retaddr);
              tss_load_seg(env,3,local_6c,uVar11,retaddr);
              tss_load_seg(env,4,(int)local_68,uVar11,retaddr);
              tss_load_seg(env,5,local_68._4_4_,uVar11,retaddr);
            }
            if (local_a0 <= env->segs[1].limit) {
              if ((env->dr[7] & 0x55) == 0) {
                return;
              }
              cpu_x86_update_dr7_x86_64(env,(uint)env->dr[7] & 0xffffffaa);
              return;
            }
            iVar3 = 0xd;
            uVar11 = 0;
          }
          else {
            if ((local_9c | 7) <= (env->gdt).limit) {
              uVar7 = 2;
              uVar6 = 2;
              aVar16 = (long)(int)(local_9c & 0xfffffff8) + (env->gdt).base;
              if (((env->hflags >> 0x17 & 1) != 0) && (uVar6 = 0, (~env->hflags & 3) != 0)) {
                uVar6 = (uint)env->eflags >> 0x11 & 2;
              }
              uVar4 = cpu_ldl_mmuidx_ra_x86_64(env,aVar16,uVar6,retaddr);
              if (((env->hflags >> 0x17 & 1) != 0) && (uVar7 = 0, (~env->hflags & 3) != 0)) {
                uVar7 = (uint)env->eflags >> 0x11 & 2;
              }
              uVar5 = cpu_ldl_mmuidx_ra_x86_64(env,aVar16 + 4,uVar7,retaddr);
              if (((uVar5 & 0x1f00) == 0x200) && ((short)uVar5 < 0)) {
                (env->ldt).base =
                     (ulong)(uVar5 & 0xff000000 | uVar4 >> 0x10 | (uVar5 & 0xff) << 0x10);
                uVar6 = uVar5 & 0xf0000 | uVar4 & 0xffff;
                uVar11 = uVar6 << 0xc | 0xfff;
                if ((uVar5 >> 0x17 & 1) == 0) {
                  uVar11 = uVar6;
                }
                (env->ldt).limit = uVar11;
                (env->ldt).flags = uVar5;
                goto LAB_0052086b;
              }
            }
            iVar3 = 10;
          }
          goto LAB_00520996;
        }
      }
      uVar11 = local_9c & 0xfffc;
LAB_0052098e:
      iVar3 = 10;
      goto LAB_00520996;
    }
  }
  uVar11 = tss_selector & 0xfffc;
  iVar3 = 0xb;
LAB_00520996:
  raise_exception_err_ra_x86_64(env,iVar3,uVar11,retaddr);
}

Assistant:

static void switch_tss_ra(CPUX86State *env, int tss_selector,
                          uint32_t e1, uint32_t e2, int source,
                          uint32_t next_eip, uintptr_t retaddr)
{
    int tss_limit, tss_limit_max, type, old_tss_limit_max, old_type, v1, v2, i;
    target_ulong tss_base;
    uint32_t new_regs[8], new_segs[6];
    uint32_t new_eflags, new_eip, new_cr3, new_ldt, new_trap;
    uint32_t old_eflags, eflags_mask;
    SegmentCache *dt;
    int index;
    target_ulong ptr;

    type = (e2 >> DESC_TYPE_SHIFT) & 0xf;
    LOG_PCALL("switch_tss: sel=0x%04x type=%d src=%d\n", tss_selector, type,
              source);

    /* if task gate, we read the TSS segment and we load it */
    if (type == 5) {
        if (!(e2 & DESC_P_MASK)) {
            raise_exception_err_ra(env, EXCP0B_NOSEG, tss_selector & 0xfffc, retaddr);
        }
        tss_selector = e1 >> 16;
        if (tss_selector & 4) {
            raise_exception_err_ra(env, EXCP0A_TSS, tss_selector & 0xfffc, retaddr);
        }
        if (load_segment_ra(env, &e1, &e2, tss_selector, retaddr) != 0) {
            raise_exception_err_ra(env, EXCP0D_GPF, tss_selector & 0xfffc, retaddr);
        }
        if (e2 & DESC_S_MASK) {
            raise_exception_err_ra(env, EXCP0D_GPF, tss_selector & 0xfffc, retaddr);
        }
        type = (e2 >> DESC_TYPE_SHIFT) & 0xf;
        if ((type & 7) != 1) {
            raise_exception_err_ra(env, EXCP0D_GPF, tss_selector & 0xfffc, retaddr);
        }
    }

    if (!(e2 & DESC_P_MASK)) {
        raise_exception_err_ra(env, EXCP0B_NOSEG, tss_selector & 0xfffc, retaddr);
    }

    if (type & 8) {
        tss_limit_max = 103;
    } else {
        tss_limit_max = 43;
    }
    tss_limit = get_seg_limit(e1, e2);
    tss_base = get_seg_base(e1, e2);
    if ((tss_selector & 4) != 0 ||
        tss_limit < tss_limit_max) {
        raise_exception_err_ra(env, EXCP0A_TSS, tss_selector & 0xfffc, retaddr);
    }
    old_type = (env->tr.flags >> DESC_TYPE_SHIFT) & 0xf;
    if (old_type & 8) {
        old_tss_limit_max = 103;
    } else {
        old_tss_limit_max = 43;
    }

    /* read all the registers from the new TSS */
    if (type & 8) {
        /* 32 bit */
        new_cr3 = cpu_ldl_kernel_ra(env, tss_base + 0x1c, retaddr);
        new_eip = cpu_ldl_kernel_ra(env, tss_base + 0x20, retaddr);
        new_eflags = cpu_ldl_kernel_ra(env, tss_base + 0x24, retaddr);
        for (i = 0; i < 8; i++) {
            new_regs[i] = cpu_ldl_kernel_ra(env, tss_base + (0x28 + i * 4),
                                            retaddr);
        }
        for (i = 0; i < 6; i++) {
            new_segs[i] = cpu_lduw_kernel_ra(env, tss_base + (0x48 + i * 4),
                                             retaddr);
        }
        new_ldt = cpu_lduw_kernel_ra(env, tss_base + 0x60, retaddr);
        new_trap = cpu_ldl_kernel_ra(env, tss_base + 0x64, retaddr);
    } else {
        /* 16 bit */
        new_cr3 = 0;
        new_eip = cpu_lduw_kernel_ra(env, tss_base + 0x0e, retaddr);
        new_eflags = cpu_lduw_kernel_ra(env, tss_base + 0x10, retaddr);
        for (i = 0; i < 8; i++) {
            new_regs[i] = cpu_lduw_kernel_ra(env, tss_base + (0x12 + i * 2),
                                             retaddr) | 0xffff0000;
        }
        for (i = 0; i < 4; i++) {
            new_segs[i] = cpu_lduw_kernel_ra(env, tss_base + (0x22 + i * 4),
                                             retaddr);
        }
        new_ldt = cpu_lduw_kernel_ra(env, tss_base + 0x2a, retaddr);
        new_segs[R_FS] = 0;
        new_segs[R_GS] = 0;
        new_trap = 0;
    }
    /* XXX: avoid a compiler warning, see
     http://support.amd.com/us/Processor_TechDocs/24593.pdf
     chapters 12.2.5 and 13.2.4 on how to implement TSS Trap bit */
    (void)new_trap;

    /* NOTE: we must avoid memory exceptions during the task switch,
       so we make dummy accesses before */
    /* XXX: it can still fail in some cases, so a bigger hack is
       necessary to valid the TLB after having done the accesses */

    v1 = cpu_ldub_kernel_ra(env, env->tr.base, retaddr);
    v2 = cpu_ldub_kernel_ra(env, env->tr.base + old_tss_limit_max, retaddr);
    cpu_stb_kernel_ra(env, env->tr.base, v1, retaddr);
    cpu_stb_kernel_ra(env, env->tr.base + old_tss_limit_max, v2, retaddr);

    /* clear busy bit (it is restartable) */
    if (source == SWITCH_TSS_JMP || source == SWITCH_TSS_IRET) {
        target_ulong ptr;
        uint32_t e2;

        ptr = env->gdt.base + (env->tr.selector & ~7);
        e2 = cpu_ldl_kernel_ra(env, ptr + 4, retaddr);
        e2 &= ~DESC_TSS_BUSY_MASK;
        cpu_stl_kernel_ra(env, ptr + 4, e2, retaddr);
    }
    old_eflags = cpu_compute_eflags(env);
    if (source == SWITCH_TSS_IRET) {
        old_eflags &= ~NT_MASK;
    }

    /* save the current state in the old TSS */
    if (type & 8) {
        /* 32 bit */
        cpu_stl_kernel_ra(env, env->tr.base + 0x20, next_eip, retaddr);
        cpu_stl_kernel_ra(env, env->tr.base + 0x24, old_eflags, retaddr);
        cpu_stl_kernel_ra(env, env->tr.base + (0x28 + 0 * 4), env->regs[R_EAX], retaddr);
        cpu_stl_kernel_ra(env, env->tr.base + (0x28 + 1 * 4), env->regs[R_ECX], retaddr);
        cpu_stl_kernel_ra(env, env->tr.base + (0x28 + 2 * 4), env->regs[R_EDX], retaddr);
        cpu_stl_kernel_ra(env, env->tr.base + (0x28 + 3 * 4), env->regs[R_EBX], retaddr);
        cpu_stl_kernel_ra(env, env->tr.base + (0x28 + 4 * 4), env->regs[R_ESP], retaddr);
        cpu_stl_kernel_ra(env, env->tr.base + (0x28 + 5 * 4), env->regs[R_EBP], retaddr);
        cpu_stl_kernel_ra(env, env->tr.base + (0x28 + 6 * 4), env->regs[R_ESI], retaddr);
        cpu_stl_kernel_ra(env, env->tr.base + (0x28 + 7 * 4), env->regs[R_EDI], retaddr);
        for (i = 0; i < 6; i++) {
            cpu_stw_kernel_ra(env, env->tr.base + (0x48 + i * 4),
                              env->segs[i].selector, retaddr);
        }
    } else {
        /* 16 bit */
        cpu_stw_kernel_ra(env, env->tr.base + 0x0e, next_eip, retaddr);
        cpu_stw_kernel_ra(env, env->tr.base + 0x10, old_eflags, retaddr);
        cpu_stw_kernel_ra(env, env->tr.base + (0x12 + 0 * 2), env->regs[R_EAX], retaddr);
        cpu_stw_kernel_ra(env, env->tr.base + (0x12 + 1 * 2), env->regs[R_ECX], retaddr);
        cpu_stw_kernel_ra(env, env->tr.base + (0x12 + 2 * 2), env->regs[R_EDX], retaddr);
        cpu_stw_kernel_ra(env, env->tr.base + (0x12 + 3 * 2), env->regs[R_EBX], retaddr);
        cpu_stw_kernel_ra(env, env->tr.base + (0x12 + 4 * 2), env->regs[R_ESP], retaddr);
        cpu_stw_kernel_ra(env, env->tr.base + (0x12 + 5 * 2), env->regs[R_EBP], retaddr);
        cpu_stw_kernel_ra(env, env->tr.base + (0x12 + 6 * 2), env->regs[R_ESI], retaddr);
        cpu_stw_kernel_ra(env, env->tr.base + (0x12 + 7 * 2), env->regs[R_EDI], retaddr);
        for (i = 0; i < 4; i++) {
            cpu_stw_kernel_ra(env, env->tr.base + (0x22 + i * 4),
                              env->segs[i].selector, retaddr);
        }
    }

    /* now if an exception occurs, it will occurs in the next task
       context */

    if (source == SWITCH_TSS_CALL) {
        cpu_stw_kernel_ra(env, tss_base, env->tr.selector, retaddr);
        new_eflags |= NT_MASK;
    }

    /* set busy bit */
    if (source == SWITCH_TSS_JMP || source == SWITCH_TSS_CALL) {
        target_ulong ptr;
        uint32_t e2;

        ptr = env->gdt.base + (tss_selector & ~7);
        e2 = cpu_ldl_kernel_ra(env, ptr + 4, retaddr);
        e2 |= DESC_TSS_BUSY_MASK;
        cpu_stl_kernel_ra(env, ptr + 4, e2, retaddr);
    }

    /* set the new CPU state */
    /* from this point, any exception which occurs can give problems */
    env->cr[0] |= CR0_TS_MASK;
    env->hflags |= HF_TS_MASK;
    env->tr.selector = tss_selector;
    env->tr.base = tss_base;
    env->tr.limit = tss_limit;
    env->tr.flags = e2 & ~DESC_TSS_BUSY_MASK;

    if ((type & 8) && (env->cr[0] & CR0_PG_MASK)) {
        cpu_x86_update_cr3(env, new_cr3);
    }

    /* load all registers without an exception, then reload them with
       possible exception */
    env->eip = new_eip;
    eflags_mask = TF_MASK | AC_MASK | ID_MASK |
        IF_MASK | IOPL_MASK | VM_MASK | RF_MASK | NT_MASK;
    if (!(type & 8)) {
        eflags_mask &= 0xffff;
    }
    cpu_load_eflags(env, new_eflags, eflags_mask);
    /* XXX: what to do in 16 bit case? */
    env->regs[R_EAX] = new_regs[0];
    env->regs[R_ECX] = new_regs[1];
    env->regs[R_EDX] = new_regs[2];
    env->regs[R_EBX] = new_regs[3];
    env->regs[R_ESP] = new_regs[4];
    env->regs[R_EBP] = new_regs[5];
    env->regs[R_ESI] = new_regs[6];
    env->regs[R_EDI] = new_regs[7];
    if (new_eflags & VM_MASK) {
        for (i = 0; i < 6; i++) {
            load_seg_vm(env, i, new_segs[i]);
        }
    } else {
        /* first just selectors as the rest may trigger exceptions */
        for (i = 0; i < 6; i++) {
            cpu_x86_load_seg_cache(env, i, new_segs[i], 0, 0, 0);
        }
    }

    env->ldt.selector = new_ldt & ~4;
    env->ldt.base = 0;
    env->ldt.limit = 0;
    env->ldt.flags = 0;

    /* load the LDT */
    if (new_ldt & 4) {
        raise_exception_err_ra(env, EXCP0A_TSS, new_ldt & 0xfffc, retaddr);
    }

    if ((new_ldt & 0xfffc) != 0) {
        dt = &env->gdt;
        index = new_ldt & ~7;
        if ((index + 7) > dt->limit) {
            raise_exception_err_ra(env, EXCP0A_TSS, new_ldt & 0xfffc, retaddr);
        }
        ptr = dt->base + index;
        e1 = cpu_ldl_kernel_ra(env, ptr, retaddr);
        e2 = cpu_ldl_kernel_ra(env, ptr + 4, retaddr);
        if ((e2 & DESC_S_MASK) || ((e2 >> DESC_TYPE_SHIFT) & 0xf) != 2) {
            raise_exception_err_ra(env, EXCP0A_TSS, new_ldt & 0xfffc, retaddr);
        }
        if (!(e2 & DESC_P_MASK)) {
            raise_exception_err_ra(env, EXCP0A_TSS, new_ldt & 0xfffc, retaddr);
        }
        load_seg_cache_raw_dt(&env->ldt, e1, e2);
    }

    /* load the segments */
    if (!(new_eflags & VM_MASK)) {
        int cpl = new_segs[R_CS] & 3;
        tss_load_seg(env, R_CS, new_segs[R_CS], cpl, retaddr);
        tss_load_seg(env, R_SS, new_segs[R_SS], cpl, retaddr);
        tss_load_seg(env, R_ES, new_segs[R_ES], cpl, retaddr);
        tss_load_seg(env, R_DS, new_segs[R_DS], cpl, retaddr);
        tss_load_seg(env, R_FS, new_segs[R_FS], cpl, retaddr);
        tss_load_seg(env, R_GS, new_segs[R_GS], cpl, retaddr);
    }

    /* check that env->eip is in the CS segment limits */
    if (new_eip > env->segs[R_CS].limit) {
        /* XXX: different exception if CALL? */
        raise_exception_err_ra(env, EXCP0D_GPF, 0, retaddr);
    }

    /* reset local breakpoints */
    if (env->dr[7] & DR7_LOCAL_BP_MASK) {
        cpu_x86_update_dr7(env, env->dr[7] & ~DR7_LOCAL_BP_MASK);
    }
}